

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.cpp
# Opt level: O2

char * __thiscall crypto::arc4::crypt(arc4 *this,char *__key,char *__salt)

{
  char *in_RAX;
  long in_RCX;
  size_t i;
  long lVar1;
  
  for (lVar1 = 0; in_RCX != lVar1; lVar1 = lVar1 + 1) {
    update(this);
    in_RAX = (char *)(ulong)(byte)(this->state[this->b] + this->state[this->a]);
    __salt[lVar1] = __key[lVar1] ^ in_RAX[(long)this->state];
  }
  return in_RAX;
}

Assistant:

void arc4::crypt(const char * in, char * out, size_t length) {
	
	for(size_t i = 0; i < length; i++) {
		update();
		out[i] = char(state[size_t(state[a] + state[b]) % sizeof(state)] ^ boost::uint8_t(in[i]));
	}
	
}